

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsConstantNotJoin(Expr *p)

{
  int iVar1;
  Expr *p_local;
  
  iVar1 = exprIsConst(p,2,0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsConstantNotJoin(Expr *p){
  return exprIsConst(p, 2, 0);
}